

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::TargetProgress::WriteProgressVariables
          (TargetProgress *this,unsigned_long total,unsigned_long *current)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long i;
  ulong uVar4;
  unsigned_long num;
  cmGeneratedFileStream fout;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&this->VariableFile,false,None);
  for (uVar4 = 1; uVar4 <= this->NumberOfActions; uVar4 = uVar4 + 1) {
    poVar1 = std::operator<<((ostream *)&fout,"CMAKE_PROGRESS_");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," = ");
    if (total < 0x65) {
      num = *current + uVar4;
      std::ostream::_M_insert<unsigned_long>((ulong)&fout);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->Marks,&num);
    }
    else {
      uVar3 = (*current + uVar4) * 100;
      uVar2 = uVar3 / total;
      if ((uVar3 - 100) / total < uVar2) {
        num = uVar2;
        std::ostream::_M_insert<unsigned_long>((ulong)&fout);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->Marks,&num);
      }
    }
    std::operator<<((ostream *)&fout,"\n");
  }
  std::operator<<((ostream *)&fout,"\n");
  *current = *current + this->NumberOfActions;
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::TargetProgress::WriteProgressVariables(
  unsigned long total, unsigned long& current)
{
  cmGeneratedFileStream fout(this->VariableFile);
  for (unsigned long i = 1; i <= this->NumberOfActions; ++i) {
    fout << "CMAKE_PROGRESS_" << i << " = ";
    if (total <= 100) {
      unsigned long num = i + current;
      fout << num;
      this->Marks.push_back(num);
    } else if (((i + current) * 100) / total >
               ((i - 1 + current) * 100) / total) {
      unsigned long num = ((i + current) * 100) / total;
      fout << num;
      this->Marks.push_back(num);
    }
    fout << "\n";
  }
  fout << "\n";
  current += this->NumberOfActions;
}